

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O3

void duckdb::ArrowTypeExtensionSet::Initialize(DBConfig *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 local_3a1;
  ArrowTypeExtensionData *local_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_398;
  ArrowTypeExtension local_390;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2f0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2e0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2d0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2c0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2b0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_2a0;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_290;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_280;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"arrow.uuid","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"w:16","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::UUID);
  local_280.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_280.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157cd86;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157cd86:
  ArrowTypeExtension::ArrowTypeExtension(&local_390,&local_50,&local_70,&local_280);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  paVar1 = &local_390.extension_metadata.vendor_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  paVar2 = &local_390.extension_metadata.extension_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_280.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"arrow.bool8","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"c","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&,duckdb::LogicalTypeId_const&,void(&)(duckdb::ClientContext&,duckdb::Vector&,duckdb::Vector&,unsigned_long),void(&)(duckdb::ClientContext&,duckdb::Vector&,duckdb::Vector&,unsigned_long)>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::BOOLEAN,&LogicalType::TINYINT,ArrowBool8::ArrowToDuck,
             ArrowBool8::DuckToArrow);
  local_290.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_290.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157cf1d;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157cf1d:
  ArrowTypeExtension::ArrowTypeExtension(&local_390,&local_90,&local_b0,&local_290);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_290.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"DuckDB","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"hugeint","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"w:16","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::HUGEINT);
  local_2a0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_2a0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157d0be;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157d0be:
  ArrowTypeExtension::ArrowTypeExtension(&local_390,&local_d0,&local_f0,&local_110,&local_2a0);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_2a0.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a0.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"DuckDB","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"uhugeint","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"w:16","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::UHUGEINT);
  local_2b0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_2b0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157d279;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157d279:
  ArrowTypeExtension::ArrowTypeExtension(&local_390,&local_130,&local_150,&local_170,&local_2b0);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_2b0.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"DuckDB","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"time_tz","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"w:8","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::TIME_TZ);
  local_2c0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_2c0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157d434;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157d434:
  ArrowTypeExtension::ArrowTypeExtension(&local_390,&local_190,&local_1b0,&local_1d0,&local_2c0);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_2c0.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c0.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"arrow.json","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::VARCHAR);
  local_2d0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_2d0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157d5a1;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157d5a1:
  ArrowTypeExtension::ArrowTypeExtension
            (&local_390,&local_1f0,ArrowJson::PopulateSchema,ArrowJson::GetType,&local_2d0);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_2d0.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"DuckDB","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"bit","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::BIT);
  local_2e0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_2e0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157d70f;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157d70f:
  ArrowTypeExtension::ArrowTypeExtension
            (&local_390,&local_210,&local_230,ArrowBit::PopulateSchema,ArrowBit::GetType,&local_2e0,
             (cast_arrow_duck_t)0x0,(cast_duck_arrow_t)0x0);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_2e0.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"DuckDB","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"varint","");
  local_3a0 = (ArrowTypeExtensionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ArrowTypeExtensionData,std::allocator<duckdb::ArrowTypeExtensionData>,duckdb::LogicalTypeId_const&>
            (&local_398,&local_3a0,(allocator<duckdb::ArrowTypeExtensionData> *)&local_3a1,
             &LogicalType::VARINT);
  local_2f0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_3a0;
  local_2f0.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_398._M_pi;
  if (local_398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_398._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0157d89e;
    }
    else {
      (local_398._M_pi)->_M_use_count = (local_398._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398._M_pi);
  }
LAB_0157d89e:
  ArrowTypeExtension::ArrowTypeExtension
            (&local_390,&local_250,&local_270,ArrowVarint::PopulateSchema,ArrowVarint::GetType,
             &local_2f0,(cast_arrow_duck_t)0x0,(cast_duck_arrow_t)0x0);
  DBConfig::RegisterArrowExtension(config,&local_390);
  if (local_390.type_extension.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.type_extension.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.arrow_format._M_dataplus._M_p !=
      &local_390.extension_metadata.arrow_format.field_2) {
    operator_delete(local_390.extension_metadata.arrow_format._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.type_name._M_dataplus._M_p !=
      &local_390.extension_metadata.type_name.field_2) {
    operator_delete(local_390.extension_metadata.type_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.vendor_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_390.extension_metadata.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.extension_metadata.extension_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_390.extension_metadata.extension_name._M_dataplus._M_p);
  }
  if (local_2f0.internal.
      super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f0.internal.
               super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ArrowTypeExtensionSet::Initialize(const DBConfig &config) {
	// Types that are 1:1
	config.RegisterArrowExtension({"arrow.uuid", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::UUID)});
	config.RegisterArrowExtension(
	    {"arrow.bool8", "c",
	     make_shared_ptr<ArrowTypeExtensionData>(LogicalType::BOOLEAN, LogicalType::TINYINT, ArrowBool8::ArrowToDuck,
	                                             ArrowBool8::DuckToArrow)});

	config.RegisterArrowExtension(
	    {"DuckDB", "hugeint", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::HUGEINT)});
	config.RegisterArrowExtension(
	    {"DuckDB", "uhugeint", "w:16", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::UHUGEINT)});
	config.RegisterArrowExtension(
	    {"DuckDB", "time_tz", "w:8", make_shared_ptr<ArrowTypeExtensionData>(LogicalType::TIME_TZ)});

	// Types that are 1:n
	config.RegisterArrowExtension({"arrow.json", &ArrowJson::PopulateSchema, &ArrowJson::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::VARCHAR)});

	config.RegisterArrowExtension({"DuckDB", "bit", &ArrowBit::PopulateSchema, &ArrowBit::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::BIT), nullptr, nullptr});

	config.RegisterArrowExtension({"DuckDB", "varint", &ArrowVarint::PopulateSchema, &ArrowVarint::GetType,
	                               make_shared_ptr<ArrowTypeExtensionData>(LogicalType::VARINT), nullptr, nullptr});
}